

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseFailureIncludesCheckExpectedAndActual::
TestCheckArrayCloseFailureIncludesCheckExpectedAndActual
          (TestCheckArrayCloseFailureIncludesCheckExpectedAndActual *this)

{
  char *suiteName;
  TestCheckArrayCloseFailureIncludesCheckExpectedAndActual *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckArrayCloseFailureIncludesCheckExpectedAndActual",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x175);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckArrayCloseFailureIncludesCheckExpectedAndActual_00183200;
  return;
}

Assistant:

TEST(CheckArrayCloseFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "xpected [ 0 1 2 3 ]"));
    CHECK(strstr(reporter.lastFailedMessage, "was [ 0 1 3 3 ]"));
}